

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  ulong uVar1;
  int iVar2;
  string tmp;
  Slice user_key;
  string local_68;
  pointer local_48;
  ulong local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  ulong local_30;
  
  local_48 = (key->_M_dataplus)._M_p;
  uVar1 = key->_M_string_length - 8;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_40 = uVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,local_48,local_48 + (key->_M_string_length - 8));
  (*this->user_comparator_->_vptr_Comparator[5])(this->user_comparator_,&local_68);
  if (local_68._M_string_length < uVar1) {
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68._M_dataplus._M_p;
    local_30 = local_68._M_string_length;
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_48);
    if (iVar2 < 0) {
      PutFixed64(&local_68,0xffffffffffffff01);
      std::__cxx11::string::swap((string *)key);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string* key) const {
  Slice user_key = ExtractUserKey(*key);
  std::string tmp(user_key.data(), user_key.size());
  user_comparator_->FindShortSuccessor(&tmp);
  if (tmp.size() < user_key.size() &&
      user_comparator_->Compare(user_key, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*key, tmp) < 0);
    key->swap(tmp);
  }
}